

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte *pbVar2;
  char cVar3;
  int iVar4;
  char **ppcVar5;
  char *pcVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  
  if (ptr == end) {
    return -1;
  }
  ppcVar5 = (char **)0x0;
  iVar4 = 0;
  if (*ptr == '-') {
    pbVar1 = (byte *)(ptr + 1);
    pcVar6 = end;
LAB_00154f2f:
    ptr = (char *)pbVar1;
    if (ptr == end) {
      return -1;
    }
    cVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    switch(cVar3) {
    case '\0':
    case '\x01':
    case '\b':
      break;
    case '\x02':
    case '\x03':
    case '\x04':
switchD_00154f71_caseD_2:
      pbVar1 = (byte *)ptr + 1;
      goto LAB_00154f2f;
    case '\x05':
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
      iVar4 = (*enc[3].scanners[2])(enc,ptr,pcVar6,ppcVar5);
      if (iVar4 == 0) {
        pbVar1 = (byte *)ptr + 2;
        pcVar6 = extraout_RDX;
        goto LAB_00154f2f;
      }
      break;
    case '\x06':
      if ((long)end - (long)ptr < 3) {
        return -2;
      }
      iVar4 = (*enc[3].scanners[3])(enc,ptr,pcVar6,ppcVar5);
      if (iVar4 == 0) {
        pbVar1 = (byte *)ptr + 3;
        pcVar6 = extraout_RDX_01;
        goto LAB_00154f2f;
      }
      break;
    case '\a':
      if ((long)end - (long)ptr < 4) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[0])(enc,ptr,pcVar6,ppcVar5);
      if (iVar4 == 0) {
        pbVar1 = (byte *)ptr + 4;
        pcVar6 = extraout_RDX_00;
        goto LAB_00154f2f;
      }
      break;
    default:
      if (cVar3 != '\x1b') goto switchD_00154f71_caseD_2;
      pbVar1 = (byte *)ptr + 1;
      if (pbVar1 == (byte *)end) {
        return -1;
      }
      if (*pbVar1 == 0x2d) goto LAB_0015500b;
      goto LAB_00154f2f;
    }
    iVar4 = 0;
  }
LAB_00154ff0:
  *nextTokPtr = ptr;
  return iVar4;
LAB_0015500b:
  if ((byte *)ptr + 2 == (byte *)end) {
    return -1;
  }
  pbVar1 = (byte *)ptr + 3;
  pbVar2 = (byte *)ptr + 2;
  ptr = (char *)((byte *)ptr + 2);
  if (*pbVar2 == 0x3e) {
    ptr = (char *)pbVar1;
  }
  iVar4 = 0xd;
  if (*pbVar2 != 0x3e) {
    iVar4 = 0;
  }
  goto LAB_00154ff0;
}

Assistant:

static
int PREFIX(scanComment)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr != end) {
    if (!CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (ptr != end) {
      switch (BYTE_TYPE(enc, ptr)) {
      INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          if ((ptr += MINBPC(enc)) == end)
            return XML_TOK_PARTIAL;
          if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}